

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O0

void __thiscall Search::findInFile(Search *this,string *path)

{
  text_style ts;
  string_view sVar1;
  string_view fmt;
  string_view sVar2;
  string_view fmt_00;
  string_view sVar3;
  string_view fmt_01;
  string_view sVar4;
  string_view fmt_02;
  string_view sVar5;
  string_view fmt_03;
  string_view sVar6;
  string_view fmt_04;
  string_view sVar7;
  string_view fmt_05;
  FILE *pFVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  _Head_base<0UL,__IO_FILE_*,_false> _Var10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  char *pcVar14;
  FILE *pFVar15;
  int *piVar16;
  void *pvVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar18;
  string *psVar19;
  v10 *pvVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar22;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  bool local_1c01;
  v10 *local_1b38 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b28 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b18 [2];
  v10 *local_1b08 [2];
  v10 *local_1af8 [2];
  undefined1 local_1ae8 [8];
  char s3 [1024];
  string local_16e0;
  char *local_16c0;
  size_t idx;
  allocator local_16a1;
  string local_16a0;
  undefined1 local_1680 [8];
  Match pmatch;
  size_t sz;
  bool nocolor;
  int linesToPrint;
  undefined1 local_1648 [3];
  bool binary;
  int lineno;
  char buf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  color_type local_1220;
  text_style local_1218;
  styled_arg<char[7]> local_1200;
  v10 *local_11e0;
  char *local_11d8;
  _func_void__IO_FILE_ptr *local_11d0;
  allocator local_11c1;
  string local_11c0 [55];
  allocator local_1189;
  string local_1188 [32];
  undefined1 local_1168 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string *path_local;
  Search *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1108;
  size_t local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10f8;
  styled_arg<char[7]> *local_10f0;
  styled_arg<char[7]> *local_10e8;
  FILE *local_10e0;
  v10 *local_10d8;
  char *pcStack_10d0;
  char *local_10c8;
  v10 **local_10c0;
  format_args local_10b8;
  char *local_10a8;
  int *local_10a0;
  format_args local_1098;
  char *local_1088;
  int *local_1080;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_1078;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_1050;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *vargs_1;
  _IO_FILE *local_1040;
  char *local_1038;
  int *piStack_1030;
  char *local_1028;
  size_t *local_1020;
  v10 *local_1018;
  char *pcStack_1010;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_1000
  ;
  v10 *local_ff8;
  char *pcStack_ff0;
  v10 *local_fe8;
  char *pcStack_fe0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_fd0;
  v10 *local_fc8;
  char *pcStack_fc0;
  char *local_fb8;
  v10 **local_fb0;
  char *local_fa8;
  v10 **local_fa0;
  v10 *local_f98;
  size_t sStack_f90;
  v10 *local_f88;
  size_t sStack_f80;
  char *local_f78;
  v10 **local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f68;
  char *pcStack_f60;
  _IO_FILE *local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f48;
  char *pcStack_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f38;
  char *pcStack_f30;
  _IO_FILE *local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f18;
  char *pcStack_f10;
  char *local_f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f00;
  char *local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_ef0;
  format_args local_ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ed8;
  size_t local_ed0;
  format_args local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_eb8;
  size_t local_eb0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ea8 [3];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_e90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  FILE *local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e78;
  size_t sStack_e70;
  char *local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_e60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e58;
  undefined1 local_e20 [16];
  v10 *local_e10;
  char *local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e00;
  styled_arg<char[7]> *local_df8;
  styled_arg<char[7]> *local_df0;
  v10 *local_de8;
  char *pcStack_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc8;
  size_t sStack_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_da8;
  size_t sStack_da0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d98;
  format_args *local_d90;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d88;
  format_args *local_d80;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d78;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d70;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d68;
  undefined8 local_d60;
  format_args *local_d58;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d50;
  undefined8 local_d48;
  format_args *local_d40;
  char *local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d30;
  char *local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d20;
  char *local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_d10;
  char *local_d08;
  v10 **local_d00;
  char *local_cf8;
  v10 **local_cf0;
  char *local_ce8;
  v10 **local_ce0;
  char *local_cd8;
  size_t *local_cd0;
  char *local_cc8;
  v10 **local_cc0;
  char *local_cb8;
  v10 **local_cb0;
  v10 *local_ca8;
  char *pcStack_ca0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c98;
  undefined1 *local_c90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c88;
  undefined8 local_c80;
  undefined1 *local_c78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_fmt::v10::detail::styled_arg<char[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c70;
  char *local_c68;
  char **local_c60;
  char *local_c58;
  int *piStack_c50;
  char **local_c40;
  char *local_c38;
  int *piStack_c30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_c20;
  format_args *local_c18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_c10;
  undefined8 local_c08;
  format_args *local_c00;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_bf8;
  format_args *local_bf0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_be8;
  undefined8 local_be0;
  format_args *local_bd8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_bd0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_bc8;
  char *local_bc0;
  v10 *local_ba8;
  char *pcStack_ba0;
  string local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b78;
  size_t local_b70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_b68;
  FILE *local_b60;
  v10 *local_b58;
  char *pcStack_b50;
  format_args local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b38;
  size_t local_b30;
  format_args local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b18;
  size_t local_b10;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b08 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_af8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  FILE *local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ae0;
  size_t sStack_ad8;
  char *local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ab8;
  size_t sStack_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a98;
  size_t sStack_a90;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a80;
  format_args *local_a78;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a70;
  format_args *local_a68;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a60;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a58;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a50;
  undefined8 local_a48;
  format_args *local_a40;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a38;
  undefined8 local_a30;
  format_args *local_a28;
  char *local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a18;
  char *local_a10;
  v10 *local_9f8;
  char *pcStack_9f0;
  string local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  size_t local_9c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_9b8;
  FILE *local_9b0;
  v10 *local_9a8;
  char *pcStack_9a0;
  format_args local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  size_t local_980;
  format_args local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_968;
  size_t local_960;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_958 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_948;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_6;
  FILE *local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_930;
  size_t sStack_928;
  char *local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_908;
  size_t sStack_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8e8;
  size_t sStack_8e0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8d0;
  format_args *local_8c8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8c0;
  format_args *local_8b8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8b0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_8a0;
  undefined8 local_898;
  format_args *local_890;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_888;
  undefined8 local_880;
  format_args *local_878;
  char *local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_868;
  char *local_860;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]>
  *local_858 [2];
  undefined1 local_848 [16];
  v10 *local_838;
  char *local_830;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_828;
  v10 *local_820;
  char *pcStack_818;
  string *local_810;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]>
  *local_808 [3];
  undefined1 local_7f0 [16];
  v10 *local_7e0;
  char *local_7d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> *local_7d0;
  v10 *local_7c8;
  char *pcStack_7c0;
  string *local_7b8;
  v10 **local_7b0;
  v10 *local_7a8;
  char *pcStack_7a0;
  v10 **local_790;
  v10 *local_788;
  char *pcStack_780;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_778
  ;
  undefined1 *local_770;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_768
  ;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_760
  ;
  undefined8 local_758;
  undefined1 *local_750;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_748
  ;
  undefined1 *local_740;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_738
  ;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]> **local_730
  ;
  undefined8 local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  v10 *local_6f8;
  size_t sStack_6f0;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6c0;
  size_t local_6b8;
  FILE *local_6b0;
  v10 *local_6a8;
  size_t sStack_6a0;
  format_args local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  size_t local_680;
  format_args local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  size_t local_660;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_658 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_648;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  FILE *local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_630;
  size_t sStack_628;
  char *local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_608;
  size_t sStack_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e8;
  size_t sStack_5e0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5d0;
  format_args *local_5c8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5c0;
  format_args *local_5b8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5b0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5a0;
  undefined8 local_598;
  format_args *local_590;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_588;
  undefined8 local_580;
  format_args *local_578;
  char *local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_568;
  char *local_560;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_558 [2];
  undefined1 local_548 [16];
  v10 *local_538;
  ulong local_530;
  v10 *local_528;
  size_t sStack_520;
  string *local_518;
  v10 **local_510;
  v10 *local_508;
  size_t sStack_500;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_4f0;
  undefined1 *local_4e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_4e0;
  undefined8 local_4d8;
  undefined1 *local_4d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_4c8;
  char *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  char *pcStack_4a0;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  size_t local_470;
  _IO_FILE *local_468;
  FILE *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  char *pcStack_450;
  format_args local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  size_t local_430;
  format_args local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  size_t local_410;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_408 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_4;
  FILE *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  size_t sStack_3d8;
  char *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  size_t sStack_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  size_t sStack_390;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_380;
  format_args *local_378;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_370;
  format_args *local_368;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_360;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_358;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_350;
  undefined8 local_348;
  format_args *local_340;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_338;
  undefined8 local_330;
  format_args *local_328;
  char *local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_318;
  char *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  char *pcStack_2f0;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  size_t local_2c0;
  _IO_FILE *local_2b8;
  FILE *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  char *pcStack_2a0;
  format_args local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  size_t local_280;
  format_args local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  size_t local_260;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_5;
  FILE *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  size_t sStack_228;
  char *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  size_t sStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  size_t sStack_1e0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1d0;
  format_args *local_1c8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c0;
  format_args *local_1b8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1b0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1a8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1a0;
  undefined8 local_198;
  format_args *local_190;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_188;
  undefined8 local_180;
  format_args *local_178;
  char *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_168;
  char *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_158 [2];
  undefined1 local_148 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *local_130;
  _IO_FILE *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  char *pcStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_108;
  undefined1 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8 [3];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  char *local_a8;
  _IO_FILE *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  string *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  char *pcStack_20;
  char *local_18;
  char *local_10;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)path;
  pcVar14 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1188,pcVar14,&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11c0,"r",&local_11c1);
  pFVar15 = Utils::fopen((char *)local_1188,(char *)local_11c0);
  local_11d0 = fclose;
  std::unique_ptr<_IO_FILE,void(*)(_IO_FILE*)>::unique_ptr<void(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,void(*)(_IO_FILE*)> *)local_1168,(pointer)pFVar15,&local_11d0);
  std::__cxx11::string::~string(local_11c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
  std::__cxx11::string::~string(local_1188);
  std::allocator<char>::~allocator((allocator<char> *)&local_1189);
  bVar11 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_1168);
  pFVar8 = _stderr;
  if (bVar11) {
    linesToPrint = 0;
    bVar11 = false;
    sz._4_4_ = 0;
    bVar12 = Args::noColor(this->_args);
    do {
      pFVar15 = (FILE *)std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                                  ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_1168);
      pcVar14 = fgets(local_1648,0x400,pFVar15);
      if (pcVar14 == (char *)0x0) break;
      pmatch._smatch._M_begin._M_current = (char *)strlen(local_1648);
      while( true ) {
        _Var9._M_current = pmatch._smatch._M_begin._M_current;
        bVar22 = false;
        if ((pmatch._smatch._M_begin._M_current != (char *)0x0) &&
           (bVar22 = true,
           (pmatch._smatch._M_begin._M_current + -0x1649)[(long)&stack0x00000000] != '\n')) {
          bVar22 = (pmatch._smatch._M_begin._M_current + -0x1649)[(long)&stack0x00000000] == '\r';
        }
        if (!bVar22) break;
        pmatch._smatch._M_begin._M_current = pmatch._smatch._M_begin._M_current + -1;
        _Var9._M_current[(long)&linesToPrint + 3] = '\0';
      }
      bVar22 = !bVar11;
      bVar11 = false;
      if (bVar22) {
        bVar22 = Args::ascii(this->_args);
        bVar11 = false;
        if (!bVar22) {
          pvVar17 = memchr(local_1648,0,(size_t)pmatch._smatch._M_begin._M_current);
          bVar11 = pvVar17 != (void *)0x0;
        }
      }
      linesToPrint = linesToPrint + 1;
      Match::Match((Match *)local_1680);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_16a0,local_1648,&local_16a1);
      bVar22 = Filter::matchContent(&this->_filter,&local_16a0,(Match *)local_1680);
      std::__cxx11::string::~string((string *)&local_16a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_16a1);
      if (bVar22) {
        bVar22 = Filter::printContent(&this->_filter);
        if (bVar22) {
          if (!bVar11) {
            local_1020 = &idx;
            local_1028 = "{} +{} : \"";
            local_cd8 = "{} +{} : \"";
            idx = (size_t)anon_var_dwarf_28e84;
            local_cd0 = local_1020;
            piStack_1030 = (int *)std::char_traits<char>::length("{} +{} : \"");
            local_bc0 = local_1028;
            local_1038 = (char *)idx;
            local_1040 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
            vargs_1 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                       *)&linesToPrint;
            ::fmt::v10::
            make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,int>
                      (&local_1078,
                       (v10 *)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                              super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vargs_1,
                       piStack_1030);
            local_1050 = &local_1078;
            bVar22 = ::fmt::v10::detail::is_utf8();
            if (bVar22) {
              local_c60 = &local_1038;
              local_1088 = local_1038;
              local_1080 = piStack_1030;
              local_bf0 = &local_1098;
              local_bf8 = local_1050;
              local_bd0 = local_1050;
              local_be0 = 0x1d;
              local_be8 = local_1050;
              local_1098.desc_ = 0x1d;
              local_1098.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_1050;
              fmt.size_ = (size_t)piStack_1030;
              fmt.data_ = local_1038;
              local_c58 = local_1088;
              piStack_c50 = local_1080;
              local_bd8 = local_bf0;
              ::fmt::v10::vprint(fmt,local_1098);
            }
            else {
              local_c40 = &local_1038;
              local_10a8 = local_1038;
              local_10a0 = piStack_1030;
              local_c18 = &local_10b8;
              local_c20 = local_1050;
              local_bc8 = local_1050;
              local_c08 = 0x1d;
              local_c10 = local_1050;
              local_10b8.desc_ = 0x1d;
              local_10b8.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_1050;
              sVar1.size_ = (size_t)piStack_1030;
              sVar1.data_ = local_1038;
              local_c38 = local_10a8;
              piStack_c30 = local_10a0;
              local_c00 = local_c18;
              ::fmt::v10::detail::vprint_mojibake(_stdout,sVar1,local_10b8);
            }
            iVar13 = (*this->_vptr_Search[2])(this,local_1648,local_1680,(ulong)bVar12);
            local_16c0 = (char *)CONCAT44(extraout_var,iVar13);
            while( true ) {
              s3[0x3fe] = '\0';
              s3[0x3fd] = '\0';
              local_1c01 = false;
              if (local_16c0 < pmatch._smatch._M_begin._M_current) {
                pcVar14 = local_1648 + (long)local_16c0;
                std::allocator<char>::allocator();
                s3[0x3fe] = '\x01';
                std::__cxx11::string::string
                          ((string *)&local_16e0,pcVar14,(allocator *)(s3 + 0x3ff));
                s3[0x3fd] = '\x01';
                local_1c01 = Filter::matchContent(&this->_filter,&local_16e0,(Match *)local_1680);
              }
              if ((s3[0x3fd] & 1U) != 0) {
                std::__cxx11::string::~string((string *)&local_16e0);
              }
              if ((s3[0x3fe] & 1U) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)(s3 + 0x3ff));
              }
              if (local_1c01 == false) break;
              iVar13 = (*this->_vptr_Search[2])
                                 (this,local_1648 + (long)local_16c0,local_1680,(ulong)bVar12);
              local_16c0 = local_16c0 + CONCAT44(extraout_var_00,iVar13);
            }
            if (local_16c0 < pmatch._smatch._M_begin._M_current) {
              Utils::strncpy_s(local_1ae8,0x400,local_1648 + (long)local_16c0,0x3ff);
              local_fb0 = local_1af8;
              local_fb8 = "{}\"";
              local_ce8 = "{}\"";
              local_1af8[0] = (v10 *)0x17127d;
              local_ce0 = local_fb0;
              pcStack_fe0 = (char *)std::char_traits<char>::length("{}\"");
              pFVar8 = _stdout;
              local_710 = local_fb8;
              local_fc8 = local_1af8[0];
              local_fd0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]>
                           *)local_1ae8;
              local_fe8 = local_1af8[0];
              local_b58 = local_1af8[0];
              local_b60 = _stdout;
              local_ac8 = &local_b78;
              local_ad0 = "{}\n";
              local_a20 = "{}\n";
              local_b78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x17227b;
              pcStack_fc0 = pcStack_fe0;
              local_b68 = local_fd0;
              pcStack_b50 = pcStack_fe0;
              local_a18 = local_ac8;
              local_b70 = std::char_traits<char>::length("{}\n");
              local_a10 = local_ad0;
              local_ba8 = local_b58;
              pcStack_ba0 = pcStack_b50;
              local_7b8 = &local_b98;
              local_7c8 = local_b58;
              pcStack_7c0 = pcStack_b50;
              local_7d0 = local_b68;
              local_7b0 = &local_7c8;
              local_7e0 = local_b58;
              local_7d8 = pcStack_b50;
              local_7a8 = local_7e0;
              pcStack_7a0 = local_7d8;
              local_808[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char[1024]>
                                       (local_b68,(v10 *)local_7b8,(char (*) [1024])local_b58);
              local_770 = local_7f0;
              local_778 = local_808;
              local_758 = 0xc;
              fmt_07.size_ = 0xc;
              fmt_07.data_ = local_7d8;
              args_00.field_1.values_ = in_R9.values_;
              args_00.desc_ = (unsigned_long_long)local_778;
              pvVar20 = local_7e0;
              local_768 = local_778;
              local_760 = local_778;
              local_750 = local_770;
              ::fmt::v10::vformat_abi_cxx11_(&local_b98,local_7e0,fmt_07,args_00);
              local_ae0 = local_b78;
              sStack_ad8 = local_b70;
              local_ae8 = pFVar8;
              vargs_2 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b98;
              local_b08[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       (vargs_2,pvVar20,local_b78);
              local_af8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                          local_b08;
              bVar22 = ::fmt::v10::detail::is_utf8();
              if (bVar22) {
                local_ac0 = &local_ae0;
                local_b18 = local_ae0;
                local_b10 = sStack_ad8;
                local_a68 = &local_b28;
                local_a70 = local_af8;
                local_a60 = local_af8;
                local_a48 = 0xd;
                local_a50 = local_af8;
                local_b28.desc_ = 0xd;
                local_b28.field_1.values_ = local_af8;
                fmt_01.size_ = sStack_ad8;
                fmt_01.data_ = (char *)local_ae0;
                local_ab8 = local_b18;
                sStack_ab0 = local_b10;
                local_a40 = local_a68;
                ::fmt::v10::vprint(local_ae8,fmt_01,local_b28);
              }
              else {
                local_aa0 = &local_ae0;
                local_b38 = local_ae0;
                local_b30 = sStack_ad8;
                local_a78 = &local_b48;
                local_a80 = local_af8;
                local_a58 = local_af8;
                local_a30 = 0xd;
                local_a38 = local_af8;
                local_b48.desc_ = 0xd;
                local_b48.field_1.values_ = local_af8;
                sVar3.size_ = sStack_ad8;
                sVar3.data_ = (char *)local_ae0;
                local_a98 = local_b38;
                sStack_a90 = local_b30;
                local_a28 = local_a78;
                ::fmt::v10::detail::vprint_mojibake(local_ae8,sVar3,local_b48);
              }
              std::__cxx11::string::~string((string *)&local_b98);
            }
            else {
              local_f70 = local_1b08;
              local_f78 = "\"";
              local_d08 = "\"";
              local_1b08[0] = (v10 *)0x172891;
              local_d00 = local_f70;
              sStack_f90 = std::char_traits<char>::length("\"");
              pFVar8 = _stdout;
              local_4c0 = local_f78;
              local_f88 = local_1b08[0];
              local_f98 = local_1b08[0];
              local_6a8 = local_1b08[0];
              local_6b0 = _stdout;
              local_618 = &local_6c0;
              local_620 = "{}\n";
              local_570 = "{}\n";
              local_6c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x17227b;
              sStack_f80 = sStack_f90;
              sStack_6a0 = sStack_f90;
              local_568 = local_618;
              local_6b8 = std::char_traits<char>::length("{}\n");
              local_560 = local_620;
              local_6f8 = local_6a8;
              sStack_6f0 = sStack_6a0;
              local_518 = &local_6e0;
              local_528 = local_6a8;
              sStack_520 = sStack_6a0;
              local_510 = &local_528;
              local_538 = local_6a8;
              local_530 = sStack_6a0;
              local_508 = local_538;
              sStack_500 = local_530;
              local_558[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_4e8 = local_548;
              local_4f0 = local_558;
              local_4d8 = 0;
              fmt_08.size_ = 0;
              fmt_08.data_ = (char *)local_530;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)local_4f0;
              pvVar20 = local_538;
              local_4e0 = local_4f0;
              local_4d0 = local_4e8;
              local_4c8 = local_4f0;
              ::fmt::v10::vformat_abi_cxx11_(&local_6e0,local_538,fmt_08,args_01);
              local_630 = local_6c0;
              sStack_628 = local_6b8;
              local_638 = pFVar8;
              vargs_3 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_6e0;
              local_658[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       (vargs_3,pvVar20,local_6c0);
              local_648 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                          local_658;
              bVar22 = ::fmt::v10::detail::is_utf8();
              if (bVar22) {
                local_610 = &local_630;
                local_668 = local_630;
                local_660 = sStack_628;
                local_5b8 = &local_678;
                local_5c0 = local_648;
                local_5b0 = local_648;
                local_598 = 0xd;
                local_5a0 = local_648;
                local_678.desc_ = 0xd;
                local_678.field_1.values_ = local_648;
                fmt_03.size_ = sStack_628;
                fmt_03.data_ = (char *)local_630;
                local_608 = local_668;
                sStack_600 = local_660;
                local_590 = local_5b8;
                ::fmt::v10::vprint(local_638,fmt_03,local_678);
              }
              else {
                local_5f0 = &local_630;
                local_688 = local_630;
                local_680 = sStack_628;
                local_5c8 = &local_698;
                local_5d0 = local_648;
                local_5a8 = local_648;
                local_580 = 0xd;
                local_588 = local_648;
                local_698.desc_ = 0xd;
                local_698.field_1.values_ = local_648;
                sVar5.size_ = sStack_628;
                sVar5.data_ = (char *)local_630;
                local_5e8 = local_688;
                sStack_5e0 = local_680;
                local_578 = local_5c8;
                ::fmt::v10::detail::vprint_mojibake(local_638,sVar5,local_698);
              }
              std::__cxx11::string::~string((string *)&local_6e0);
            }
            sz._4_4_ = Args::extraContent(this->_args);
            goto LAB_0011cba3;
          }
          local_f00 = local_1b18;
          local_f08 = "{} : binary file matches";
          local_d18 = "{} : binary file matches";
          local_1b18[0] =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x172893;
          local_d10 = local_f00;
          pcStack_f30 = (char *)std::char_traits<char>::length("{} : binary file matches");
          pFVar8 = _stdout;
          local_18 = local_f08;
          local_f18 = local_1b18[0];
          local_f20 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
          local_f38 = local_1b18[0];
          local_458 = local_1b18[0];
          local_460 = _stdout;
          local_468 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                      super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
          local_3c8 = &local_478;
          local_3d0 = "{}\n";
          local_320 = "{}\n";
          local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17227b;
          pcStack_f10 = pcStack_f30;
          pcStack_450 = pcStack_f30;
          local_318 = local_3c8;
          local_470 = std::char_traits<char>::length("{}\n");
          local_310 = local_3d0;
          local_4a8 = local_458;
          pcStack_4a0 = pcStack_450;
          local_88 = &local_498;
          local_98 = local_458;
          pcStack_90 = pcStack_450;
          local_a0 = local_468;
          local_50 = &local_98;
          local_b0 = local_458;
          local_a8 = pcStack_450;
          local_48 = local_b0;
          pcStack_40 = local_a8;
          local_d8[0] = ::fmt::v10::
                        make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                  ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_468,(v10 *)local_88,local_458);
          local_78 = local_c0;
          local_80 = local_d8;
          local_60 = 0xd;
          fmt_09.size_ = 0xd;
          fmt_09.data_ = local_a8;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_80;
          pbVar21 = local_b0;
          local_70 = local_80;
          local_68 = local_80;
          local_58 = local_78;
          ::fmt::v10::vformat_abi_cxx11_(&local_498,(v10 *)local_b0,fmt_09,args_02);
          local_3e0 = local_478;
          sStack_3d8 = local_470;
          local_3e8 = pFVar8;
          vargs_4 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_498;
          local_408[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                   (vargs_4,(v10 *)pbVar21,local_478);
          local_3f8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_408;
          bVar22 = ::fmt::v10::detail::is_utf8();
          if (bVar22) {
            local_3c0 = &local_3e0;
            local_418 = local_3e0;
            local_410 = sStack_3d8;
            local_368 = &local_428;
            local_370 = local_3f8;
            local_360 = local_3f8;
            local_348 = 0xd;
            local_350 = local_3f8;
            local_428.desc_ = 0xd;
            local_428.field_1.values_ = local_3f8;
            fmt_04.size_ = sStack_3d8;
            fmt_04.data_ = (char *)local_3e0;
            local_3b8 = local_418;
            sStack_3b0 = local_410;
            local_340 = local_368;
            ::fmt::v10::vprint(local_3e8,fmt_04,local_428);
          }
          else {
            local_3a0 = &local_3e0;
            local_438 = local_3e0;
            local_430 = sStack_3d8;
            local_378 = &local_448;
            local_380 = local_3f8;
            local_358 = local_3f8;
            local_330 = 0xd;
            local_338 = local_3f8;
            local_448.desc_ = 0xd;
            local_448.field_1.values_ = local_3f8;
            sVar6.size_ = sStack_3d8;
            sVar6.data_ = (char *)local_3e0;
            local_398 = local_438;
            sStack_390 = local_430;
            local_328 = local_378;
            ::fmt::v10::detail::vprint_mojibake(local_3e8,sVar6,local_448);
          }
          std::__cxx11::string::~string((string *)&local_498);
          buf[0x3fc] = '\x03';
          buf[0x3fd] = '\0';
          buf[0x3fe] = '\0';
          buf[0x3ff] = '\0';
        }
        else {
          Args::execCmd_abi_cxx11_(this->_args);
          uVar18 = std::__cxx11::string::empty();
          if ((uVar18 & 1) == 0) {
            psVar19 = Args::execCmd_abi_cxx11_(this->_args);
            (*this->_vptr_Search[4])
                      (this,psVar19,
                       f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                       super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                       super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
            buf[0x3fc] = '\x03';
            buf[0x3fd] = '\0';
            buf[0x3fe] = '\0';
            buf[0x3ff] = '\0';
          }
          else {
            local_ef0 = local_1b28;
            local_ef8 = "{}";
            local_d28 = "{}";
            local_1b28[0] =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1728ad;
            local_d20 = local_ef0;
            pcStack_f60 = (char *)std::char_traits<char>::length("{}");
            pFVar8 = _stdout;
            local_10 = local_ef8;
            local_f48 = local_1b28[0];
            local_f50 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
            local_f68 = local_1b28[0];
            local_2a8 = local_1b28[0];
            local_2b0 = _stdout;
            local_2b8 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
            local_218 = &local_2c8;
            local_220 = "{}\n";
            local_170 = "{}\n";
            local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x17227b;
            pcStack_f40 = pcStack_f60;
            pcStack_2a0 = pcStack_f60;
            local_168 = local_218;
            local_2c0 = std::char_traits<char>::length("{}\n");
            local_160 = local_220;
            local_2f8 = local_2a8;
            pcStack_2f0 = pcStack_2a0;
            local_110 = &local_2e8;
            local_120 = local_2a8;
            pcStack_118 = pcStack_2a0;
            local_128 = local_2b8;
            local_30 = &local_120;
            local_138 = local_2a8;
            local_130 = pcStack_2a0;
            local_28 = local_138;
            pcStack_20 = local_130;
            local_158[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_2b8,(v10 *)local_110,local_2a8);
            local_100 = local_148;
            local_108 = local_158;
            local_e8 = 0xd;
            fmt_10.size_ = 0xd;
            fmt_10.data_ = local_130;
            args_03.field_1.values_ = in_R9.values_;
            args_03.desc_ = (unsigned_long_long)local_108;
            pbVar21 = local_138;
            local_f8 = local_108;
            local_f0 = local_108;
            local_e0 = local_100;
            ::fmt::v10::vformat_abi_cxx11_(&local_2e8,(v10 *)local_138,fmt_10,args_03);
            local_230 = local_2c8;
            sStack_228 = local_2c0;
            local_238 = pFVar8;
            vargs_5 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_2e8;
            local_258[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                     (vargs_5,(v10 *)pbVar21,local_2c8);
            local_248 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                        local_258;
            bVar22 = ::fmt::v10::detail::is_utf8();
            if (bVar22) {
              local_210 = &local_230;
              local_268 = local_230;
              local_260 = sStack_228;
              local_1b8 = &local_278;
              local_1c0 = local_248;
              local_1b0 = local_248;
              local_198 = 0xd;
              local_1a0 = local_248;
              local_278.desc_ = 0xd;
              local_278.field_1.values_ = local_248;
              fmt_05.size_ = sStack_228;
              fmt_05.data_ = (char *)local_230;
              local_208 = local_268;
              sStack_200 = local_260;
              local_190 = local_1b8;
              ::fmt::v10::vprint(local_238,fmt_05,local_278);
            }
            else {
              local_1f0 = &local_230;
              local_288 = local_230;
              local_280 = sStack_228;
              local_1c8 = &local_298;
              local_1d0 = local_248;
              local_1a8 = local_248;
              local_180 = 0xd;
              local_188 = local_248;
              local_298.desc_ = 0xd;
              local_298.field_1.values_ = local_248;
              sVar7.size_ = sStack_228;
              sVar7.data_ = (char *)local_230;
              local_1e8 = local_288;
              sStack_1e0 = local_280;
              local_178 = local_1c8;
              ::fmt::v10::detail::vprint_mojibake(local_238,sVar7,local_298);
            }
            std::__cxx11::string::~string((string *)&local_2e8);
            buf[0x3fc] = '\x03';
            buf[0x3fd] = '\0';
            buf[0x3fe] = '\0';
            buf[0x3ff] = '\0';
          }
        }
      }
      else {
LAB_0011cba3:
        if (0 < sz._4_4_) {
          local_fa0 = local_1b38;
          local_fa8 = "\t{}";
          local_cf8 = "\t{}";
          local_1b38[0] = (v10 *)0x1728ac;
          local_cf0 = local_fa0;
          pcStack_1010 = (char *)std::char_traits<char>::length("\t{}");
          pFVar8 = _stdout;
          local_718 = local_fa8;
          local_ff8 = local_1b38[0];
          local_1000 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[1024]>
                        *)local_1648;
          local_1018 = local_1b38[0];
          local_9a8 = local_1b38[0];
          local_9b0 = _stdout;
          local_918 = &local_9c8;
          local_920 = "{}\n";
          local_870 = "{}\n";
          local_9c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17227b;
          pcStack_ff0 = pcStack_1010;
          local_9b8 = local_1000;
          pcStack_9a0 = pcStack_1010;
          local_868 = local_918;
          local_9c0 = std::char_traits<char>::length("{}\n");
          local_860 = local_920;
          local_9f8 = local_9a8;
          pcStack_9f0 = pcStack_9a0;
          local_810 = &local_9e8;
          local_820 = local_9a8;
          pcStack_818 = pcStack_9a0;
          local_828 = local_9b8;
          local_790 = &local_820;
          local_838 = local_9a8;
          local_830 = pcStack_9a0;
          local_788 = local_838;
          pcStack_780 = local_830;
          local_858[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char[1024]>
                                   (local_9b8,(v10 *)local_810,(char (*) [1024])local_9a8);
          local_740 = local_848;
          local_748 = local_858;
          local_728 = 0xc;
          fmt_11.size_ = 0xc;
          fmt_11.data_ = local_830;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)local_748;
          pvVar20 = local_838;
          local_738 = local_748;
          local_730 = local_748;
          local_720 = local_740;
          ::fmt::v10::vformat_abi_cxx11_(&local_9e8,local_838,fmt_11,args_04);
          local_930 = local_9c8;
          sStack_928 = local_9c0;
          local_938 = pFVar8;
          vargs_6 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9e8;
          local_958[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                   (vargs_6,pvVar20,local_9c8);
          local_948 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_958;
          bVar22 = ::fmt::v10::detail::is_utf8();
          if (bVar22) {
            local_910 = &local_930;
            local_968 = local_930;
            local_960 = sStack_928;
            local_8b8 = &local_978;
            local_8c0 = local_948;
            local_8b0 = local_948;
            local_898 = 0xd;
            local_8a0 = local_948;
            local_978.desc_ = 0xd;
            local_978.field_1.values_ = local_948;
            fmt_02.size_ = sStack_928;
            fmt_02.data_ = (char *)local_930;
            local_908 = local_968;
            sStack_900 = local_960;
            local_890 = local_8b8;
            ::fmt::v10::vprint(local_938,fmt_02,local_978);
          }
          else {
            local_8f0 = &local_930;
            local_988 = local_930;
            local_980 = sStack_928;
            local_8c8 = &local_998;
            local_8d0 = local_948;
            local_8a8 = local_948;
            local_880 = 0xd;
            local_888 = local_948;
            local_998.desc_ = 0xd;
            local_998.field_1.values_ = local_948;
            sVar4.size_ = sStack_928;
            sVar4.data_ = (char *)local_930;
            local_8e8 = local_988;
            sStack_8e0 = local_980;
            local_878 = local_8c8;
            ::fmt::v10::detail::vprint_mojibake(local_938,sVar4,local_998);
          }
          std::__cxx11::string::~string((string *)&local_9e8);
          sz._4_4_ = sz._4_4_ + -1;
        }
        buf[0x3fc] = '\0';
        buf[0x3fd] = '\0';
        buf[0x3fe] = '\0';
        buf[0x3ff] = '\0';
      }
      Match::~Match((Match *)local_1680);
    } while (buf._1020_4_ == 0);
    buf[0x3fc] = '\0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
  }
  else {
    local_10c0 = &local_11e0;
    local_10c8 = "{} Failed to open file {} : {}";
    local_cc8 = "{} Failed to open file {} : {}";
    local_11e0 = (v10 *)0x172869;
    local_cc0 = local_10c0;
    local_11d8 = (char *)std::char_traits<char>::length("{} Failed to open file {} : {}");
    local_c68 = local_10c8;
    ::fmt::v10::detail::color_type::color_type(&local_1220,red);
    ::fmt::v10::fg(&local_1218,local_1220);
    ts.background_color = local_1218.background_color;
    ts.foreground_color = local_1218.foreground_color;
    ts.set_foreground_color = local_1218.set_foreground_color;
    ts.set_background_color = local_1218.set_background_color;
    ts.ems = local_1218.ems;
    ts._19_1_ = local_1218._19_1_;
    ::fmt::v10::styled<char[7]>(&local_1200,(char (*) [7])"ERROR:",ts);
    _Var10 = f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
             super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
             super__Head_base<0UL,__IO_FILE_*,_false>;
    piVar16 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)&local_1240,*piVar16);
    local_10d8 = local_11e0;
    pcStack_10d0 = local_11d8;
    local_10e0 = pFVar8;
    local_10e8 = &local_1200;
    local_10f0 = (styled_arg<char[7]> *)_Var10._M_head_impl;
    local_10f8 = &local_1240;
    local_e60 = &local_1108;
    local_e68 = "{}\n";
    local_d38 = "{}\n";
    local_1108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17227b;
    local_d30 = local_e60;
    local_1100 = std::char_traits<char>::length("{}\n");
    local_cb8 = local_e68;
    local_dd8 = &local_1128;
    local_de8 = local_10d8;
    pcStack_de0 = pcStack_10d0;
    local_df0 = local_10e8;
    local_df8 = local_10f0;
    local_e00 = local_10f8;
    local_cb0 = &local_de8;
    local_e10 = local_10d8;
    local_e08 = pcStack_10d0;
    local_ca8 = local_e10;
    pcStack_ca0 = local_e08;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::detail::styled_arg<char[7]>,std::__cxx11::string_const,std::__cxx11::string>
              (&local_e58,(v10 *)local_10e8,local_10f0,local_10f8,local_dd8);
    local_c90 = local_e20;
    local_c98 = &local_e58;
    local_c80 = 0xddf;
    fmt_06.size_ = 0xddf;
    fmt_06.data_ = local_e08;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c98;
    pvVar20 = local_e10;
    local_c88 = local_c98;
    local_c78 = local_c90;
    local_c70 = local_c98;
    ::fmt::v10::vformat_abi_cxx11_(&local_1128,local_e10,fmt_06,args);
    local_e78 = local_1108;
    sStack_e70 = local_1100;
    local_e80 = pFVar8;
    vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1128;
    local_ea8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                             (vargs,pvVar20,local_1108);
    local_e90 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_ea8;
    bVar11 = ::fmt::v10::detail::is_utf8();
    if (bVar11) {
      local_dd0 = &local_e78;
      local_eb8 = local_e78;
      local_eb0 = sStack_e70;
      local_d80 = &local_ec8;
      local_d88 = local_e90;
      local_d78 = local_e90;
      local_d60 = 0xd;
      local_d68 = local_e90;
      local_ec8.desc_ = 0xd;
      local_ec8.field_1.values_ = local_e90;
      fmt_00.size_ = sStack_e70;
      fmt_00.data_ = (char *)local_e78;
      local_dc8 = local_eb8;
      sStack_dc0 = local_eb0;
      local_d58 = local_d80;
      ::fmt::v10::vprint(local_e80,fmt_00,local_ec8);
    }
    else {
      local_db0 = &local_e78;
      local_ed8 = local_e78;
      local_ed0 = sStack_e70;
      local_d90 = &local_ee8;
      local_d98 = local_e90;
      local_d70 = local_e90;
      local_d48 = 0xd;
      local_d50 = local_e90;
      local_ee8.desc_ = 0xd;
      local_ee8.field_1.values_ = local_e90;
      sVar2.size_ = sStack_e70;
      sVar2.data_ = (char *)local_e78;
      local_da8 = local_ed8;
      sStack_da0 = local_ed0;
      local_d40 = local_d90;
      ::fmt::v10::detail::vprint_mojibake(local_e80,sVar2,local_ee8);
    }
    std::__cxx11::string::~string((string *)&local_1128);
    std::__cxx11::string::~string((string *)&local_1240);
    buf[0x3fc] = '\x01';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
  }
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_1168);
  return;
}

Assistant:

void Search::findInFile(std::string const & path) const
{
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return;
    }

    char buf[BUF_SIZE];
    int lineno = 0;
    bool binary = false;
    int linesToPrint = 0;
    bool const nocolor = _args.noColor();
    while (fgets(buf, BUF_SIZE, f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }

        // Check for a binary file
        binary = !binary && !_args.ascii() && memchr(buf, 0, sz) != nullptr;

        ++lineno;
        Match pmatch;
        if (_filter.matchContent(buf, &pmatch)) {
            if (_filter.printContent()) {
                if (!binary) {

                    fmt::print("{} +{} : \"", path, lineno);

                    // Print content
                    size_t idx = printMatch(buf, pmatch, nocolor);

                    // Repeat search for more matches
                    while (idx < sz && _filter.matchContent(&buf[idx], &pmatch)) {
                        idx += printMatch(&buf[idx], pmatch, nocolor);
                    }

                    // The remainder of the line
                    if (idx < sz) {
                        char s3[BUF_SIZE];
                        Utils::strncpy_s(s3, BUF_SIZE, &buf[idx], BUF_SIZE - 1);
                        fmt::println("{}\"", s3);
                    }
                    else {
                        fmt::println("\"");
                    }

                    linesToPrint = _args.extraContent();
                }
                else {
                    // Print only file name and exit
                    fmt::println("{} : binary file matches", path);
                    break;
                }
            }
            else if (!_args.execCmd().empty()) {
                // Run the command and exit
                execCmd(_args.execCmd(), path);
                break;
            }
            else {
                // Print only file name and exit
                fmt::println("{}", path);
                break;
            }
        }

        // Print extra content
        if (linesToPrint > 0) {
            fmt::println("\t{}", buf);
            --linesToPrint;
        }
    }
}